

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void last_insert_rowid(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  anon_union_8_5_44880d43_for_u aVar1;
  
  aVar1 = (anon_union_8_5_44880d43_for_u)((context->s).db)->lastRowid;
  sqlite3VdbeMemRelease(&context->s);
  (context->s).u = aVar1;
  (context->s).flags = 4;
  (context->s).type = '\x01';
  return;
}

Assistant:

static void last_insert_rowid(
  sqlite3_context *context, 
  int NotUsed, 
  sqlite3_value **NotUsed2
){
  sqlite3 *db = sqlite3_context_db_handle(context);
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  /* IMP: R-51513-12026 The last_insert_rowid() SQL function is a
  ** wrapper around the sqlite3_last_insert_rowid() C/C++ interface
  ** function. */
  sqlite3_result_int64(context, sqlite3_last_insert_rowid(db));
}